

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcStatesPartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int k;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  uVar1 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  iVar2 = (this->super_BeagleCPUImpl<double,_1,_0>).kPaddedPatternCount;
  iVar5 = startPattern * 4;
  for (uVar7 = 0; uVar7 != (~((int)uVar1 >> 0x1f) & uVar1); uVar7 = uVar7 + 1) {
    iVar4 = (int)uVar7 * 0x14;
    lVar8 = (long)iVar5 + 3;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = matrices2[uVar7 * 0x14];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = matrices2[uVar7 * 0x14 + 1];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = matrices2[uVar7 * 0x14 + 2];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = matrices2[uVar7 * 0x14 + 3];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = matrices2[uVar7 * 0x14 + 5];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = matrices2[uVar7 * 0x14 + 6];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = matrices2[uVar7 * 0x14 + 7];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = matrices2[uVar7 * 0x14 + 8];
    auVar24._8_8_ = 0;
    auVar24._0_8_ = matrices2[uVar7 * 0x14 + 10];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = matrices2[uVar7 * 0x14 + 0xb];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = matrices2[uVar7 * 0x14 + 0xc];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = matrices2[uVar7 * 0x14 + 0xd];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = matrices2[uVar7 * 0x14 + 0xf];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = matrices2[uVar7 * 0x14 + 0x10];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = matrices2[uVar7 * 0x14 + 0x11];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = matrices2[uVar7 * 0x14 + 0x12];
    lVar6 = (long)startPattern;
    while (lVar6 < endPattern) {
      iVar3 = states1[lVar6];
      lVar6 = lVar6 + 1;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = partials2[lVar8 + -2];
      auVar9 = vmulsd_avx512f(auVar17,auVar15);
      auVar10 = vmulsd_avx512f(auVar21,auVar15);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = partials2[lVar8 + -2];
      auVar11 = vmulsd_avx512f(auVar25,auVar32);
      auVar12 = vmulsd_avx512f(auVar29,auVar32);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = partials2[lVar8 + -3];
      auVar9 = vfmadd231sd_avx512f(auVar9,auVar16,auVar13);
      auVar10 = vfmadd231sd_avx512f(auVar10,auVar20,auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = partials2[lVar8 + -3];
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar24,auVar14);
      auVar12 = vfmadd231sd_avx512f(auVar12,auVar28,auVar14);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = partials2[lVar8 + -1];
      auVar9 = vfmadd231sd_avx512f(auVar9,auVar18,auVar33);
      auVar10 = vfmadd231sd_avx512f(auVar10,auVar22,auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = partials2[lVar8 + -1];
      auVar11 = vfmadd231sd_avx512f(auVar11,auVar26,auVar34);
      auVar12 = vfmadd231sd_avx512f(auVar12,auVar30,auVar34);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = partials2[lVar8];
      auVar13 = vfmadd231sd_avx512f(auVar9,auVar19,auVar35);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = matrices1[iVar3 + iVar4];
      auVar9 = vmulsd_avx512f(auVar13,auVar9);
      auVar13 = vfmadd231sd_avx512f(auVar10,auVar23,auVar35);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = partials2[lVar8];
      auVar14 = vfmadd231sd_avx512f(auVar11,auVar27,auVar36);
      auVar15 = vfmadd231sd_avx512f(auVar12,auVar31,auVar36);
      vmovsd_avx512f(auVar9);
      destP[lVar8 + -3] = destP[lVar8 + -3];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = matrices1[iVar3 + iVar4 + 5];
      auVar9 = vmulsd_avx512f(auVar13,auVar10);
      vmovsd_avx512f(auVar9);
      destP[lVar8 + -2] = destP[lVar8 + -2];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = matrices1[iVar3 + iVar4 + 10];
      auVar9 = vmulsd_avx512f(auVar14,auVar11);
      vmovsd_avx512f(auVar9);
      destP[lVar8 + -1] = destP[lVar8 + -1];
      auVar12._8_8_ = 0;
      auVar12._0_8_ = matrices1[iVar3 + iVar4 + 0xf];
      auVar9 = vmulsd_avx512f(auVar15,auVar12);
      vmovsd_avx512f(auVar9);
      destP[lVar8] = destP[lVar8];
      lVar8 = lVar8 + 4;
    }
    iVar5 = iVar5 + iVar2 * 4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcStatesPartials(REALTYPE* destP,
                                                                 const int* states1,
                                                                 const REALTYPE* matrices1,
                                                                 const REALTYPE* partials2,
                                                                 const REALTYPE* matrices2,
                                                                 int startPattern,
                                                                 int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            const int state1 = states1[k];

            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23;

            destP[u    ] = matrices1[w            + state1] * sum20;
            destP[u + 1] = matrices1[w + OFFSET*1 + state1] * sum21;
            destP[u + 2] = matrices1[w + OFFSET*2 + state1] * sum22;
            destP[u + 3] = matrices1[w + OFFSET*3 + state1] * sum23;

            u += 4;
        }
    }
}